

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::Substitute(Codec *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  PeelRow *pPVar7;
  uint16_t *puVar8;
  uint uVar9;
  uint8_t *puVar10;
  uint16_t column_i;
  ulong uVar11;
  uint uVar12;
  uint i;
  uint uVar13;
  long lVar14;
  uint8_t *vz;
  uint uVar15;
  short sVar16;
  uint8_t *puVar17;
  bool bVar18;
  ushort auStack_36 [3];
  
  puVar8 = &this->_peel_head_rows;
  do {
    uVar1 = *puVar8;
    uVar12 = (uint)uVar1;
    if (uVar12 == 0xffff) {
      return;
    }
    pPVar7 = this->_peel_rows;
    puVar17 = this->_recovery_blocks;
    puVar10 = this->_input_blocks;
    uVar2 = this->_mix_count;
    uVar3 = this->_mix_next_prime;
    uVar4 = pPVar7[uVar12].Marks.Unmarked[0];
    uVar5 = pPVar7[uVar12].Params.MixAdd;
    uVar13 = this->_block_bytes;
    uVar6 = pPVar7[uVar12].Params.MixFirst;
    uVar9 = (uint)uVar6;
    for (lVar14 = 1; lVar14 != 3; lVar14 = lVar14 + 1) {
      uVar9 = ((uVar9 & 0xffff) + (uint)uVar5) % (uint)uVar3;
      if (uVar2 <= uVar9) {
        uVar9 = uVar3 - uVar9;
        uVar15 = uVar9 & 0xffff;
        if (uVar5 < (ushort)uVar9) {
          uVar9 = ((uint)uVar5 * 0x10000 - uVar15) % (uint)uVar5;
        }
        else {
          uVar9 = uVar5 - uVar15;
        }
      }
      auStack_36[lVar14] = (ushort)uVar9;
    }
    vz = puVar17 + uVar4 * uVar13;
    puVar17 = puVar17 + ((uint)uVar6 + (uint)this->_block_count) * uVar13;
    if (this->_block_count - 1 == (uint)uVar1) {
      gf256_addset_mem(vz,puVar17,puVar10 + uVar13 * uVar1,this->_input_final_bytes);
      uVar13 = this->_input_final_bytes;
      memcpy(vz + uVar13,puVar17 + uVar13,(ulong)(this->_block_bytes - uVar13));
    }
    else {
      gf256_addset_mem(vz,puVar17,puVar10 + uVar13 * uVar1,uVar13);
    }
    uVar13 = this->_block_bytes;
    gf256_add2_mem(vz,this->_recovery_blocks +
                      ((uint)auStack_36[1] + (uint)this->_block_count) * uVar13,
                   this->_recovery_blocks +
                   ((uint)auStack_36[2] + (uint)this->_block_count) * uVar13,uVar13);
    uVar1 = pPVar7[uVar12].Params.PeelCount;
    if (1 < uVar1) {
      uVar2 = this->_block_next_prime;
      uVar3 = this->_block_count;
      uVar5 = pPVar7[uVar12].Params.PeelFirst;
      uVar6 = pPVar7[uVar12].Params.PeelAdd;
      uVar13 = (uint)uVar6;
      uVar11 = (ulong)((uint)uVar6 + (uint)uVar5) % (ulong)uVar2;
      if ((uint)uVar3 <= (uint)uVar11) {
        uVar9 = (uint)uVar2 - (uint)uVar11;
        uVar15 = uVar9 & 0xffff;
        if (uVar6 < (ushort)uVar9) {
          uVar11 = (ulong)(uVar13 * 0x10000 - uVar15) % (ulong)uVar13;
        }
        else {
          uVar11 = (ulong)(uVar13 - uVar15);
        }
      }
      puVar17 = this->_recovery_blocks;
      uVar9 = this->_block_bytes;
      uVar15 = (uint)uVar11 & 0xffff;
      if (uVar5 == uVar4) {
        puVar10 = puVar17 + uVar15 * uVar9;
LAB_00106a72:
        gf256_add_mem(vz,puVar10,uVar9);
      }
      else {
        puVar10 = puVar17 + uVar5 * uVar9;
        if ((ushort)uVar11 == uVar4) goto LAB_00106a72;
        gf256_add2_mem(vz,puVar10,puVar17 + uVar15 * uVar9,uVar9);
      }
      sVar16 = uVar1 - 2;
      while (bVar18 = sVar16 != 0, sVar16 = sVar16 + -1, bVar18) {
        uVar11 = (ulong)(((uint)uVar11 & 0xffff) + uVar13) % (ulong)uVar2;
        if ((uint)uVar3 <= (uint)uVar11) {
          uVar9 = (uint)uVar2 - (uint)uVar11;
          uVar15 = uVar9 & 0xffff;
          if (uVar6 < (ushort)uVar9) {
            uVar11 = (ulong)(uVar13 * 0x10000 - uVar15) % (ulong)uVar13;
          }
          else {
            uVar11 = (ulong)(uVar13 - uVar15);
          }
        }
        if ((ushort)uVar11 != uVar4) {
          gf256_add_mem(vz,this->_recovery_blocks + ((uint)uVar11 & 0xffff) * this->_block_bytes,
                        this->_block_bytes);
        }
      }
    }
    puVar8 = &pPVar7[uVar12].NextRow;
  } while( true );
}

Assistant:

void Codec::Substitute()
{
    CAT_IF_DUMP(cout << endl << "---- Substitute ----" << endl << endl;)

    CAT_IF_ROWOP(uint32_t rowops = 0;)

    PeelRow * GF256_RESTRICT row;

    // For each column that has been peeled:
    for (uint16_t row_i = _peel_head_rows; row_i != LIST_TERM; row_i = row->NextRow)
    {
        row = &_peel_rows[row_i];

        const uint16_t dest_column_i = row->Marks.Result.PeelColumn;
        CAT_DEBUG_ASSERT(dest_column_i < _recovery_rows);
        uint8_t * GF256_RESTRICT dest = _recovery_blocks + _block_bytes * dest_column_i;

        CAT_IF_DUMP(cout << "Generating column " << dest_column_i << ":";)

        const uint8_t * GF256_RESTRICT input_src = _input_blocks + _block_bytes * row_i;
        CAT_IF_DUMP(cout << " " << row_i << ":[" << (unsigned)input_src[0] << "]";)

        const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

        // Set up mixing column generator
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]);

        // If copying from final block:
        if (row_i != _block_count - 1) {
            gf256_addset_mem(dest, src, input_src, _block_bytes);
        }
        else
        {
            gf256_addset_mem(dest, src, input_src, _input_final_bytes);
            memcpy(
                dest + _input_final_bytes,
                src + _input_final_bytes,
                _block_bytes - _input_final_bytes);
        }
        CAT_IF_ROWOP(++rowops;)

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src0 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
        const uint8_t * GF256_RESTRICT src1 = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);

        // Add next two mixing columns in
        gf256_add2_mem(dest, src0, src1, _block_bytes);

        CAT_IF_ROWOP(++rowops;)

        // If at least two peeling columns are set:
        if (row->Params.PeelCount >= 2) // common case:
        {
            PeelRowIterator iter(row->Params, _block_count, _block_next_prime);

            const uint16_t column_0 = iter.GetColumn();
            iter.Iterate();
            const uint16_t column_1 = iter.GetColumn();

            // Common case:
            if (column_0 != dest_column_i)
            {
                CAT_DEBUG_ASSERT(column_0 < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel0 = _recovery_blocks + _block_bytes * column_0;

                // Common case:
                if (column_1 != dest_column_i) {
                    CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                    gf256_add2_mem(dest, peel0, _recovery_blocks + _block_bytes * column_1, _block_bytes);
                }
                else {
                    gf256_add_mem(dest, peel0, _block_bytes);
                }
            }
            else {
                CAT_DEBUG_ASSERT(column_1 < _recovery_rows);
                gf256_add_mem(dest, _recovery_blocks + _block_bytes * column_1, _block_bytes);
            }
            CAT_IF_ROWOP(++rowops;)

            // For each remaining column:
            while (iter.Iterate())
            {
                const uint16_t column_i = iter.GetColumn();
                CAT_DEBUG_ASSERT(column_i < _recovery_rows);
                const uint8_t * GF256_RESTRICT peel_src = _recovery_blocks + _block_bytes * column_i;

                CAT_IF_DUMP(cout << " " << column_i;)

                // If column is not the solved one:
                if (column_i != dest_column_i)
                {
                    gf256_add_mem(dest, peel_src, _block_bytes);
                    CAT_IF_ROWOP(++rowops;)
                    CAT_IF_DUMP(cout << "[" << (unsigned)peel_src[0] << "]";)
                }
                else {
                    CAT_IF_DUMP(cout << "*";)
                }
            }
        } // end if weight 2

        CAT_IF_DUMP(cout << endl;)
    }

    CAT_IF_ROWOP(cout << "Substitute used " << rowops << " row ops = " << rowops / (double)_block_count << "*N" << endl;)
}